

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_clusterizer.h
# Opt level: O2

void __thiscall
crnlib::clusterizer<crnlib::vec<6U,_float>_>::clear(clusterizer<crnlib::vec<6U,_float>_> *this)

{
  vector<std::pair<crnlib::vec<6U,_float>,_unsigned_int>_>::clear(&this->m_training_vecs);
  vector<crnlib::vec<6U,_float>_>::clear(&this->m_codebook);
  vector<crnlib::clusterizer<crnlib::vec<6U,_float>_>::vq_node>::clear(&this->m_nodes);
  this->m_overall_variance = 0.0;
  this->m_split_index = 0;
  this->m_heap_size = 0;
  this->m_quick = false;
  return;
}

Assistant:

void clear()
        {
            m_training_vecs.clear();
            m_codebook.clear();
            m_nodes.clear();
            m_overall_variance = 0.0f;
            m_split_index = 0;
            m_heap_size = 0;
            m_quick = false;
        }